

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall sf::Text::Text(Text *this)

{
  Drawable *in_RDI;
  size_t unaff_retaddr;
  PrimitiveType in_stack_0000000c;
  VertexArray *in_stack_00000010;
  Transformable *in_stack_ffffffffffffffd0;
  
  Drawable::Drawable(in_RDI);
  Transformable::Transformable(in_stack_ffffffffffffffd0);
  in_RDI->_vptr_Drawable = (_func_int **)&PTR__Text_002f8650;
  in_RDI[1]._vptr_Drawable = (_func_int **)&PTR__Text_002f8678;
  String::String((String *)0x21e173);
  in_RDI[0x1b]._vptr_Drawable = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[0x1c]._vptr_Drawable = 0x1e;
  *(undefined4 *)((long)&in_RDI[0x1c]._vptr_Drawable + 4) = 0x3f800000;
  *(undefined4 *)&in_RDI[0x1d]._vptr_Drawable = 0x3f800000;
  *(undefined4 *)((long)&in_RDI[0x1d]._vptr_Drawable + 4) = 0;
  Color::Color((Color *)(in_RDI + 0x1e),0xff,0xff,0xff,0xff);
  Color::Color((Color *)((long)&in_RDI[0x1e]._vptr_Drawable + 4),'\0','\0','\0',0xff);
  *(undefined4 *)&in_RDI[0x1f]._vptr_Drawable = 0;
  VertexArray::VertexArray(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  VertexArray::VertexArray(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  Rect<float>::Rect((Rect<float> *)(in_RDI + 0x2a));
  *(undefined1 *)&in_RDI[0x2c]._vptr_Drawable = 0;
  in_RDI[0x2d]._vptr_Drawable = (_func_int **)0x0;
  return;
}

Assistant:

Text::Text() :
m_string             (),
m_font               (NULL),
m_characterSize      (30),
m_letterSpacingFactor(1.f),
m_lineSpacingFactor  (1.f),
m_style              (Regular),
m_fillColor          (255, 255, 255),
m_outlineColor       (0, 0, 0),
m_outlineThickness   (0),
m_vertices           (Triangles),
m_outlineVertices    (Triangles),
m_bounds             (),
m_geometryNeedUpdate (false),
m_fontTextureId      (0)
{

}